

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
detail::writer::operator()(writer *this,optional_field<example::decimal_t,_1UL> *val)

{
  value_type *pvVar1;
  char *pcVar2;
  ulong uVar3;
  size_t target_size;
  undefined8 uVar4;
  size_t __n;
  uint tmp;
  undefined1 local_14 [4];
  
  pvVar1 = this->optv_;
  if (pvVar1 != (value_type *)0x0) {
    if ((val->super_optional<example::decimal_t>).super_type.m_initialized == true) {
      (this->opts_).super__Base_bitset<1UL>._M_w = 0xffff;
      *pvVar1 = 0xffff;
      pcVar2 = (char *)(this->buf_).data_;
      uVar3 = (this->buf_).size_;
      if (uVar3 != 0) {
        *pcVar2 = (val->super_optional<example::decimal_t>).super_type.m_storage.dummy_.data[0];
      }
      if (1 < uVar3) {
        __n = 4;
        if (uVar3 - 1 < 4) {
          __n = uVar3 - 1;
        }
        memcpy(pcVar2 + 1,local_14,__n);
      }
    }
    return;
  }
  uVar4 = __cxa_allocate_exception(0x40);
  bad_message();
  __cxa_throw(uVar4,&boost::system::system_error::typeinfo,
              boost::system::system_error::~system_error);
}

Assistant:

void operator()(example::optional_field<T, N> const& val) const {
        if (!optv_)
            throw bad_message();
        if (val) {
            opts_.set();
            *optv_ = static_cast<example::opt_fields::value_type>(opts_.to_ulong());
            (*this)(*val);
        }
    }